

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lisp2c.c
# Opt level: O2

int LispIntToCInt(LispPTR lispint)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  char msg [200];
  char acStack_d8 [208];
  
  if ((lispint & 0xffff0000) == 0xf0000) {
    return lispint | 0xffff0000;
  }
  if ((lispint & 0xffff0000) == 0xe0000) {
    return lispint & 0xffff;
  }
  if ((*(ushort *)((ulong)(lispint >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
    pLVar2 = NativeAligned4FromLAddr(lispint);
    LVar1 = *pLVar2;
  }
  else {
    sprintf(acStack_d8,"Arg 0x%x isn\'t a lisp integer.",lispint);
    error(acStack_d8);
    LVar1 = 0;
  }
  return LVar1;
}

Assistant:

int LispIntToCInt(LispPTR lispint) {
  switch ((0xFFFF0000 & lispint)) {
    case S_POSITIVE: return (lispint & 0xFFFF);
    case S_NEGATIVE: return (lispint | 0xFFFF0000);
    default:
      if (GetTypeNumber(lispint) == TYPE_FIXP) {
        return (*((int *)NativeAligned4FromLAddr(lispint)));
      } else {
        char msg[200];
        sprintf(msg, "Arg 0x%x isn't a lisp integer.", lispint);
        error(msg);
        /* NOTREACHED */
        return(0);
      }
  }
}